

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

SUNErrCode N_VBufUnpack(N_Vector x,void *buf)

{
  SUNErrCode SVar1;
  
  SVar1 = (*x->ops->nvbufunpack)(x,buf);
  return SVar1;
}

Assistant:

SUNErrCode N_VBufUnpack(N_Vector x, void* buf)
{
  SUNFunctionBegin(x->sunctx);
  SUNErrCode ier = SUN_SUCCESS;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));
  SUNAssert(x->ops->nvbufunpack, SUN_ERR_NOT_IMPLEMENTED);
  ier = x->ops->nvbufunpack(x, buf);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return (ier);
}